

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_gnutar.c
# Opt level: O3

void test_write_format_gnutar(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  void *buff;
  archive *paVar4;
  archive_entry *paVar5;
  la_ssize_t lVar6;
  time_t v2;
  long v2_00;
  char *pcVar7;
  la_int64_t lVar8;
  size_t used;
  size_t local_40;
  archive_entry *local_38;
  
  buff = malloc(1000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'j',(uint)(buff != (void *)0x0),"buff != NULL",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'm',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_gnutar(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'n',(uint)(iVar1 == 0),"0 == archive_write_set_format_gnutar(a)",paVar4);
  iVar1 = archive_write_add_filter_none(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'o',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar4);
  iVar1 = archive_write_open_memory(paVar4,buff,1000000,&local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'p',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, buffsize, &used)",paVar4);
  paVar5 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'u',(uint)(paVar5 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_atime(paVar5,2,0x14);
  archive_entry_set_birthtime(paVar5,3,0x1e);
  archive_entry_set_ctime(paVar5,4,0x28);
  archive_entry_set_mtime(paVar5,5,0x32);
  archive_entry_copy_pathname(paVar5,"file");
  archive_entry_set_mode(paVar5,0x81ed);
  archive_entry_set_size(paVar5,8);
  iVar1 = archive_write_header(paVar4,paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'}',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(paVar5);
  lVar6 = archive_write_data(paVar4,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'\x7f',8,"8",lVar6,"archive_write_data(a, \"12345678\", 9)",paVar4);
  paVar5 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'\x84',(uint)(paVar5 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname
            (paVar5,
             "abcdefghijklmnopqrstuvwxyz1234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890"
            );
  archive_entry_set_mode(paVar5,0x81ed);
  archive_entry_set_size(paVar5,8);
  iVar1 = archive_write_header(paVar4,paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'\x88',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(paVar5);
  lVar6 = archive_write_data(paVar4,"abcdefgh",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'\x8a',8,"8",lVar6,"archive_write_data(a, \"abcdefgh\", 9)",paVar4);
  paVar5 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'\x8f',(uint)(paVar5 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname
            (paVar5,
             "Yabcdefghijklmnopqrstuvwxyz1234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890"
            );
  archive_entry_copy_hardlink
            (paVar5,
             "abcdefghijklmnopqrstuvwxyz1234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890"
            );
  archive_entry_set_mode(paVar5,0x81ed);
  archive_entry_set_size(paVar5,8);
  iVar1 = archive_write_header(paVar4,paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'\x94',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(paVar5);
  paVar5 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'\x9a',(uint)(paVar5 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname
            (paVar5,
             "Xabcdefghijklmnopqrstuvwxyz1234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890"
            );
  archive_entry_copy_symlink
            (paVar5,
             "abcdefghijklmnopqrstuvwxyz1234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890"
            );
  archive_entry_set_mode(paVar5,0xa1ed);
  iVar1 = archive_write_header(paVar4,paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'\x9e',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(paVar5);
  paVar5 = archive_entry_new();
  local_38 = paVar5;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'¤',(uint)(paVar5 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar5,"large_uid_gid");
  archive_entry_set_mode(paVar5,0x81ed);
  archive_entry_set_size(paVar5,8);
  archive_entry_set_uid(paVar5,0x75bcd15);
  archive_entry_set_gid(paVar5,0x3ade68b1);
  iVar1 = archive_write_header(paVar4,paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ª',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(paVar5);
  lVar6 = archive_write_data(paVar4,"abcdefgh",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'¬',8,"8",lVar6,"archive_write_data(a, \"abcdefgh\", 9)",paVar4);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'²',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'³',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",paVar4);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'º',(void *)((long)buff + 0x101),"buff + 257","ustar  ","\"ustar  \\0\"",8,
                      "8",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'¼',0x3c00,"15360",local_40,"used",(void *)0x0);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'Ã',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ä',0,"0",(long)iVar1,"archive_read_support_format_all(a)",paVar4);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Å',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",paVar4);
  iVar1 = archive_read_open_memory(paVar4,buff,local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Æ',0,"0",(long)iVar1,"archive_read_open_memory(a, buff, used)",paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ë',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  wVar2 = archive_entry_atime_is_set(local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'Ì',(uint)(wVar2 == L'\0'),"!archive_entry_atime_is_set(ae)",(void *)0x0);
  wVar2 = archive_entry_birthtime_is_set(local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'Í',(uint)(wVar2 == L'\0'),"!archive_entry_birthtime_is_set(ae)",(void *)0x0);
  wVar2 = archive_entry_ctime_is_set(local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                   ,L'Î',(uint)(wVar2 == L'\0'),"!archive_entry_ctime_is_set(ae)",(void *)0x0);
  v2 = archive_entry_mtime(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ï',5,"5",v2,"archive_entry_mtime(ae)",(void *)0x0);
  v2_00 = archive_entry_mtime_nsec(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ð',0,"0",v2_00,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  pcVar7 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
             ,L'Ñ',"file","\"file\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ò',0x81ed,"S_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar8 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ó',8,"8",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar6 = archive_read_data(paVar4,buff2,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ô',8,"8",lVar6,"archive_read_data(a, buff2, 10)",paVar4);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Õ',buff2,"buff2","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ú',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pcVar7 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
             ,L'Û',
             "abcdefghijklmnopqrstuvwxyz1234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890"
             ,"longfilename",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ü',0x81ed,"S_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar8 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Ý',8,"8",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar6 = archive_read_data(paVar4,buff2,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'Þ',8,"8",lVar6,"archive_read_data(a, buff2, 10)",paVar4);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ß',buff2,"buff2","abcdefgh","\"abcdefgh\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ä',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pcVar7 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
             ,L'å',
             "Yabcdefghijklmnopqrstuvwxyz1234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890"
             ,"longhardlinkname",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  pcVar7 = archive_entry_hardlink(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
             ,L'æ',
             "abcdefghijklmnopqrstuvwxyz1234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890"
             ,"longfilename",pcVar7,"archive_entry_hardlink(ae)",(void *)0x0,L'\0');
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ë',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pcVar7 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
             ,L'ì',
             "Xabcdefghijklmnopqrstuvwxyz1234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890"
             ,"longlinkname",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  pcVar7 = archive_entry_symlink(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
             ,L'í',
             "abcdefghijklmnopqrstuvwxyz1234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890"
             ,"longfilename",pcVar7,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'î',0xa1ed,"AE_IFLNK | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ó',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  lVar8 = archive_entry_uid(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ô',0x75bcd15,"123456789",lVar8,"archive_entry_uid(ae)",(void *)0x0);
  lVar8 = archive_entry_gid(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'õ',0x3ade68b1,"987654321",lVar8,"archive_entry_gid(ae)",(void *)0x0);
  pcVar7 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
             ,L'ö',"large_uid_gid","\"large_uid_gid\"",pcVar7,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'÷',0x81ed,"S_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ü',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'ý',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar.c"
                      ,L'þ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",paVar4);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_gnutar)
{
	size_t buffsize = 1000000;
	char *buff;
	struct archive_entry *ae;
	struct archive *a;
	size_t used;

	buff = malloc(buffsize); /* million bytes of work area */
	assert(buff != NULL);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_gnutar(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * "file" has a bunch of attributes and 8 bytes of data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	/*
	 * A file with a very long name
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, longfilename);
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "abcdefgh", 9));

	/*
	 * A hardlink to the above file.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, longhardlinkname);
	archive_entry_copy_hardlink(ae, longfilename);
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * A symlink to the above file.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, longlinkname);
	archive_entry_copy_symlink(ae, longfilename);
	archive_entry_set_mode(ae, AE_IFLNK | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * A file with large UID/GID that overflow octal encoding.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "large_uid_gid");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	archive_entry_set_uid(ae, 123456789);
	archive_entry_set_gid(ae, 987654321);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "abcdefgh", 9));

	/* TODO: support GNU tar sparse format and test it here. */
	/* See test_write_format_pax for an example of testing sparse files. */

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	/*
	 * Some basic verification of the low-level format.
	 */

	/* Verify GNU tar magic/version fields */
	assertEqualMem(buff + 257, "ustar  \0", 8);

	assertEqualInt(15360, used);

	/*
	 *
	 * Now, read the data back.
	 *
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, 0, archive_read_support_format_all(a));
	assertEqualIntA(a, 0, archive_read_support_filter_all(a));
	assertEqualIntA(a, 0, archive_read_open_memory(a, buff, used));

	/*
	 * Read "file"
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assert(!archive_entry_atime_is_set(ae));
	assert(!archive_entry_birthtime_is_set(ae));
	assert(!archive_entry_ctime_is_set(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assertEqualInt(S_IFREG | 0755, archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "12345678", 8);

	/*
	 * Read file with very long name.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualString(longfilename, archive_entry_pathname(ae));
	assertEqualInt(S_IFREG | 0755, archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "abcdefgh", 8);

	/*
	 * Read hardlink.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualString(longhardlinkname, archive_entry_pathname(ae));
	assertEqualString(longfilename, archive_entry_hardlink(ae));

	/*
	 * Read symlink.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualString(longlinkname, archive_entry_pathname(ae));
	assertEqualString(longfilename, archive_entry_symlink(ae));
	assertEqualInt(AE_IFLNK | 0755, archive_entry_mode(ae));

	/*
	 * Read file with large UID/GID.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(123456789, archive_entry_uid(ae));
	assertEqualInt(987654321, archive_entry_gid(ae));
	assertEqualString("large_uid_gid", archive_entry_pathname(ae));
	assertEqualInt(S_IFREG | 0755, archive_entry_mode(ae));

	/*
	 * Verify the end of the archive.
	 */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));

	free(buff);
}